

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::HttpServer::listenLoop(HttpServer *this,ConnectionReceiver *port)

{
  CoroutineBase *this_00;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *__return_storage_ptr__;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *promise;
  kj *this_01;
  long *plVar1;
  PromiseArenaMember *pPVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined8 in_RDX;
  Own<kj::AsyncIoStream,_std::nullptr_t> OVar4;
  anon_class_16_2_55776b59 local_48;
  undefined8 local_38;
  
  coroutine._M_fr_ptr = operator_new(0x430);
  *(code **)coroutine._M_fr_ptr = listenLoop;
  *(code **)((long)coroutine._M_fr_ptr + 8) = listenLoop;
  this_00 = (CoroutineBase *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x420) = in_RDX;
  *(ConnectionReceiver **)((long)coroutine._M_fr_ptr + 0x418) = port;
  local_48.this = (HttpServer *)0x587dd6;
  local_48.connection = (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x5886c0;
  local_38 = 0x1f00001fdd;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  location.function = "listenLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1fdd;
  location.columnNumber = 0x1f;
  kj::_::CoroutineBase::CoroutineBase
            (this_00,coroutine,(ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
       ((long)coroutine._M_fr_ptr + 0x238);
  promise = (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
            ((long)coroutine._M_fr_ptr + 0x408);
  this_01 = (kj *)((long)coroutine._M_fr_ptr + 0x410);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)this_00;
  while( true ) {
    (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x420))(promise);
    co_await<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>(__return_storage_ptr__,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,this_00);
    if (bVar3) break;
    OVar4 = kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::await_resume
                      ((PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
                       ((long)coroutine._M_fr_ptr + 0x3f8));
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x3f0);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 1000))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 1000),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10),OVar4.ptr);
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    pPVar2 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar2);
    }
    local_48.this = *(HttpServer **)((long)coroutine._M_fr_ptr + 0x418);
    local_48.connection =
         (Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0x3f8);
    evalNow<kj::HttpServer::listenLoop(kj::ConnectionReceiver&)::__0>(this_01,&local_48);
    TaskSet::add((TaskSet *)(*(long *)((long)coroutine._M_fr_ptr + 0x418) + 0xb0),
                 (Promise<void> *)this_01);
    pPVar2 = *(PromiseArenaMember **)this_01;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      *(undefined8 *)this_01 = 0;
      kj::_::PromiseDisposer::dispose(pPVar2);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x400);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x400) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x3f8))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x3f8),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::listenLoop(kj::ConnectionReceiver& port) {
  for (;;) {
    auto connection = co_await port.accept();
    tasks.add(kj::evalNow([&]() { return listenHttp(kj::mv(connection)); }));
  }
}